

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  uint uVar1;
  ImFontGlyph *pIVar2;
  ushort in_DX;
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float in_stack_00000008;
  float pad;
  ImFontGlyph *glyph;
  float char_off_x;
  float advance_x_original;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  float local_20;
  float local_18;
  
  local_20 = in_XMM2_Da;
  local_18 = in_XMM0_Da;
  if (in_RSI != 0) {
    fVar3 = ImClamp<float>(in_stack_00000008,*(float *)(in_RSI + 0x40),*(float *)(in_RSI + 0x44));
    if ((fVar3 != in_stack_00000008) || (NAN(fVar3) || NAN(in_stack_00000008))) {
      if ((*(byte *)(in_RSI + 0x20) & 1) == 0) {
        in_stack_ffffffffffffffa4 = (fVar3 - in_stack_00000008) * 0.5;
        in_stack_00000008 = fVar3;
      }
      else {
        fVar4 = fVar3 - in_stack_00000008;
        in_stack_00000008 = fVar3;
        in_stack_ffffffffffffffa4 = ImFloor(fVar4 * 0.5);
      }
      local_18 = in_stack_ffffffffffffffa4 + in_XMM0_Da;
      local_20 = in_stack_ffffffffffffffa4 + in_XMM2_Da;
      fVar3 = in_stack_00000008;
    }
    in_stack_00000008 = fVar3;
    if ((*(byte *)(in_RSI + 0x20) & 1) != 0) {
      in_stack_00000008 = (float)(int)(in_stack_00000008 + 0.5);
    }
    in_stack_00000008 = *(float *)(in_RSI + 0x24) + in_stack_00000008;
  }
  ImVector<ImFontGlyph>::resize
            ((ImVector<ImFontGlyph> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c);
  pIVar2 = ImVector<ImFontGlyph>::back((ImVector<ImFontGlyph> *)(in_RDI + 0x28));
  *(uint *)pIVar2 = *(uint *)pIVar2 & 3 | (uint)in_DX << 2;
  uVar1 = 0;
  if ((local_18 != local_20) || (NAN(local_18) || NAN(local_20))) {
    uVar1 = (uint)(in_XMM1_Da != in_XMM3_Da);
  }
  *(uint *)pIVar2 = *(uint *)pIVar2 & 0xfffffffd | uVar1 << 1;
  *(uint *)pIVar2 = *(uint *)pIVar2 & 0xfffffffe;
  pIVar2->X0 = local_18;
  pIVar2->Y0 = in_XMM1_Da;
  pIVar2->X1 = local_20;
  pIVar2->Y1 = in_XMM3_Da;
  pIVar2->U0 = in_XMM4_Da;
  pIVar2->V0 = in_XMM5_Da;
  pIVar2->U1 = in_XMM6_Da;
  pIVar2->V1 = in_XMM7_Da;
  pIVar2->AdvanceX = in_stack_00000008;
  fVar3 = (float)*(int *)(*(long *)(in_RDI + 0x40) + 0x14) + 0.99;
  *(undefined1 *)(in_RDI + 0x56) = 1;
  *(int *)(in_RDI + 100) =
       (int)((pIVar2->U1 - pIVar2->U0) * (float)*(int *)(*(long *)(in_RDI + 0x40) + 0x28) + fVar3) *
       (int)((pIVar2->V1 - pIVar2->V0) * (float)*(int *)(*(long *)(in_RDI + 0x40) + 0x2c) + fVar3) +
       *(int *)(in_RDI + 100);
  return;
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}